

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

int __thiscall
ncnn::Mat::clone(Mat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  int i;
  size_t size;
  Mat *m;
  Mat *in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  int iVar5;
  size_t in_stack_fffffffffffffef0;
  int _h;
  undefined8 in_stack_fffffffffffffef8;
  int _w;
  Mat *in_stack_ffffffffffffff00;
  Mat *in_stack_ffffffffffffff08;
  Allocator *in_stack_ffffffffffffff10;
  Mat *this_00;
  Mat local_d0;
  Mat local_88;
  int local_3c;
  size_t local_38;
  undefined1 local_19;
  void *local_18;
  __fn *local_10;
  Mat *local_8;
  
  this_00 = this;
  local_18 = __child_stack;
  local_10 = __fn;
  local_8 = this;
  bVar1 = empty(in_stack_fffffffffffffee0);
  if (bVar1) {
    Mat(this_00);
  }
  else {
    local_19 = 0;
    Mat(this_00);
    iVar5 = (int)(in_stack_fffffffffffffee8 >> 0x20);
    _w = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
    if (*(int *)(__fn + 0x28) == 1) {
      create(in_stack_ffffffffffffff00,_w,in_stack_fffffffffffffef0,iVar5,
             (Allocator *)in_stack_fffffffffffffee0);
    }
    else {
      _h = (int)in_stack_fffffffffffffef8;
      if (*(int *)(__fn + 0x28) == 2) {
        create(in_stack_ffffffffffffff00,_w,_h,in_stack_fffffffffffffef0,iVar5,
               (Allocator *)in_stack_fffffffffffffee0);
      }
      else {
        iVar5 = (int)(in_stack_fffffffffffffef0 >> 0x20);
        if (*(int *)(__fn + 0x28) == 3) {
          create(in_stack_ffffffffffffff00,_w,_h,iVar5,in_stack_fffffffffffffee8,
                 (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_ffffffffffffff10);
        }
        else if (*(int *)(__fn + 0x28) == 4) {
          create(in_stack_ffffffffffffff00,_w,_h,iVar5,(int)in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffee8,(int)in_stack_ffffffffffffff10,(Allocator *)this_00);
        }
      }
    }
    sVar2 = total((Mat *)__fn);
    if (sVar2 != 0) {
      if (*(size_t *)(__fn + 0x40) == this_00->cstep) {
        pvVar3 = this_00->data;
        pvVar4 = *(void **)__fn;
        sVar2 = total((Mat *)__fn);
        memcpy(pvVar3,pvVar4,sVar2 * *(long *)(__fn + 0x10));
      }
      else {
        local_38 = (long)*(int *)(__fn + 0x2c) * (long)*(int *)(__fn + 0x30) *
                   (long)*(int *)(__fn + 0x34) * *(long *)(__fn + 0x10);
        for (local_3c = 0; local_3c < *(int *)(__fn + 0x38); local_3c = local_3c + 1) {
          channel(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
          pvVar3 = operator_cast_to_void_(&local_88);
          channel(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
          pvVar4 = operator_cast_to_void_(&local_d0);
          memcpy(pvVar3,pvVar4,local_38);
          ~Mat((Mat *)0x16ca1c);
          ~Mat((Mat *)0x16ca29);
        }
      }
    }
  }
  return (int)this;
}

Assistant:

Mat Mat::clone(Allocator* _allocator) const
{
    if (empty())
        return Mat();

    Mat m;
    if (dims == 1)
        m.create(w, elemsize, elempack, _allocator);
    else if (dims == 2)
        m.create(w, h, elemsize, elempack, _allocator);
    else if (dims == 3)
        m.create(w, h, c, elemsize, elempack, _allocator);
    else if (dims == 4)
        m.create(w, h, d, c, elemsize, elempack, _allocator);

    if (total() > 0)
    {
        if (cstep == m.cstep)
            memcpy(m.data, data, total() * elemsize);
        else
        {
            // copy by channel for differnet cstep
            size_t size = (size_t)w * h * d * elemsize;
            for (int i = 0; i < c; i++)
            {
                memcpy(m.channel(i), channel(i), size);
            }
        }
    }

    return m;
}